

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int isolat1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  undefined4 in_EAX;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  iVar6 = (int)out;
  iVar4 = (int)in;
  auVar10._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar10._4_4_ = -(uint)(in == (uchar *)0x0);
  auVar10._8_4_ = -(uint)(outlen == (int *)0x0);
  auVar10._12_4_ = -(uint)(inlen == (int *)0x0);
  iVar3 = movmskps(in_EAX,auVar10);
  if (iVar3 != 0) {
    return -1;
  }
  pbVar1 = out + *outlen;
  pbVar7 = in + *inlen;
  pbVar8 = out + (long)*outlen + -1;
  pbVar5 = pbVar7;
  while ((in < pbVar7 && (out < pbVar8))) {
    if ((char)*in < '\0') {
      *out = *in >> 6 | 0xc0;
      out[1] = *in & 0x3f | 0x80;
      out = out + 2;
      in = in + 1;
    }
    lVar9 = (long)pbVar1 - (long)out;
    if (lVar9 < (long)pbVar5 - (long)in) {
      pbVar5 = in + lVar9;
    }
    for (; (in < pbVar5 && (-1 < (char)*in)); in = in + 1) {
      *out = *in;
      out = out + 1;
    }
  }
  if ((in < pbVar7) && ((out < pbVar1 && (bVar2 = *in, -1 < (char)bVar2)))) {
    in = in + 1;
    *out = bVar2;
    out = out + 1;
  }
  *outlen = (int)out - iVar6;
  *inlen = (int)in - iVar4;
  return *outlen;
}

Assistant:

int
isolat1ToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend;
    const unsigned char* inend;
    const unsigned char* instop;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(-1);

    outend = out + *outlen;
    inend = in + (*inlen);
    instop = inend;

    while ((in < inend) && (out < outend - 1)) {
	if (*in >= 0x80) {
	    *out++ = (((*in) >>  6) & 0x1F) | 0xC0;
            *out++ = ((*in) & 0x3F) | 0x80;
	    ++in;
	}
	if ((instop - in) > (outend - out)) instop = in + (outend - out);
	while ((in < instop) && (*in < 0x80)) {
	    *out++ = *in++;
	}
    }
    if ((in < inend) && (out < outend) && (*in < 0x80)) {
        *out++ = *in++;
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(*outlen);
}